

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_regular_mode.h
# Opt level: O3

int32_t __thiscall
charls::context_regular_mode::get_golomb_coding_parameter(context_regular_mode *this)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  do {
    uVar1 = uVar1 + 1;
    if (0xf < uVar1) break;
  } while (this->n_ << ((byte)uVar1 & 0x1f) < this->a_);
  if (uVar1 != 0x10) {
    return uVar1;
  }
  get_golomb_coding_parameter();
}

Assistant:

FORCE_INLINE int32_t get_golomb_coding_parameter() const
    {
        int32_t k{};
        for (; n_ << k < a_ && k < max_k_value; ++k)
        {
        }

        if (UNLIKELY(k == max_k_value))
            impl::throw_jpegls_error(jpegls_errc::invalid_encoded_data);

        return k;
    }